

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O2

void build_succ_ci(s3wid_t w,int32 append_filler,s3cipid_t *succ_ci)

{
  dictword_t *pdVar1;
  dict_t *pdVar2;
  s3wid_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)mdef->n_ciphone;
  if (mdef->n_ciphone < 1) {
    uVar4 = uVar5;
  }
  for (; pdVar2 = dict, uVar4 != uVar5; uVar5 = uVar5 + 1) {
    succ_ci[uVar5] = 0;
  }
  for (; psVar3 = fillwid, -1 < w; w = pdVar1[(uint)w].alt) {
    pdVar1 = pdVar2->word;
    succ_ci[(uint)(int)*pdVar1[(uint)w].ciphone] = 1;
  }
  if (append_filler != 0) {
    for (lVar7 = 0; uVar8 = psVar3[lVar7], -1 < (int)uVar8; lVar7 = lVar7 + 1) {
      for (; -1 < (int)uVar8; uVar8 = pdVar1[uVar8].alt) {
        pdVar1 = pdVar2->word;
        succ_ci[(uint)(int)*pdVar1[uVar8].ciphone] = 1;
      }
    }
  }
  iVar6 = 0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (succ_ci[uVar5] != 0) {
      succ_ci[iVar6] = (s3cipid_t)uVar5;
      iVar6 = iVar6 + 1;
    }
  }
  succ_ci[iVar6] = -1;
  return;
}

Assistant:

static void
build_succ_ci(s3wid_t w, int32 append_filler, s3cipid_t * succ_ci)
{
    int32 i, p;

    for (p = 0; p < mdef->n_ciphone; p++)
        succ_ci[p] = 0;

    for (; IS_S3WID(w); w = dict->word[w].alt)
        succ_ci[(unsigned) dict->word[w].ciphone[0]] = 1;

    if (append_filler) {
        for (i = 0; IS_S3WID(fillwid[i]); i++)
            for (w = fillwid[i]; IS_S3WID(w); w = dict->word[w].alt)
                succ_ci[(unsigned) dict->word[w].ciphone[0]] = 1;
    }

    i = 0;
    for (p = 0; p < mdef->n_ciphone; p++) {
        if (succ_ci[p])
            succ_ci[i++] = p;
    }
    succ_ci[i] = BAD_S3CIPID;
}